

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Inst * Inst::unifyVariable(Inst *__return_storage_ptr__,Register r)

{
  initializer_list<Arg> args;
  Arg local_48;
  
  Arg::Arg(&local_48,r);
  args._M_len = 1;
  args._M_array = &local_48;
  Inst(__return_storage_ptr__,UnifyVariable,args);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static Inst unifyVariable(Register r) {
    return Inst(InstTag::UnifyVariable, {r});
    }